

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_pack.c
# Opt level: O2

void pack_int(char **buf,ck_uint32 val)

{
  *(ck_uint32 *)*buf = val >> 0x18 | (val & 0xff0000) >> 8 | (val & 0xff00) << 8 | val << 0x18;
  *buf = *buf + 4;
  return;
}

Assistant:

static void pack_int(char **buf, ck_uint32 val)
{
    unsigned char *ubuf = (unsigned char *)*buf;
    ck_uint32 uval = val;

    ubuf[0] = (unsigned char)((uval >> 24) & 0xFF);
    ubuf[1] = (unsigned char)((uval >> 16) & 0xFF);
    ubuf[2] = (unsigned char)((uval >> 8) & 0xFF);
    ubuf[3] = (unsigned char)(uval & 0xFF);

    *buf += 4;
}